

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_426d84::PointerType::printLeft(PointerType *this,OutputStream *s)

{
  Kind KVar1;
  bool bVar2;
  StringView local_80;
  undefined8 local_70;
  _func_int **local_68;
  StringView local_60;
  Node *local_50;
  ObjCProtoName *objcProto;
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *s_local;
  PointerType *this_local;
  
  local_18 = s;
  s_local = (OutputStream *)this;
  KVar1 = Node::getKind(this->Pointee);
  if ((KVar1 == KObjCProtoName) &&
     (bVar2 = ObjCProtoName::isObjCObject((ObjCProtoName *)this->Pointee), bVar2)) {
    local_50 = this->Pointee;
    StringView::StringView(&local_60,"id<");
    OutputStream::operator+=(local_18,local_60);
    local_70._0_1_ = local_50[1].K;
    local_70._1_1_ = local_50[1].RHSComponentCache;
    local_70._2_1_ = local_50[1].ArrayCache;
    local_70._3_1_ = local_50[1].FunctionCache;
    local_70._4_4_ = *(undefined4 *)&local_50[1].field_0xc;
    local_68 = local_50[2]._vptr_Node;
    OutputStream::operator+=(local_18,*(StringView *)&local_50[1].K);
    StringView::StringView(&local_80,">");
    OutputStream::operator+=(local_18,local_80);
  }
  else {
    (*this->Pointee->_vptr_Node[4])(this->Pointee,local_18);
    bVar2 = Node::hasArray(this->Pointee,local_18);
    if (bVar2) {
      StringView::StringView(&local_28," ");
      OutputStream::operator+=(local_18,local_28);
    }
    bVar2 = Node::hasArray(this->Pointee,local_18);
    if ((bVar2) || (bVar2 = Node::hasFunction(this->Pointee,local_18), bVar2)) {
      StringView::StringView(&local_38,"(");
      OutputStream::operator+=(local_18,local_38);
    }
    StringView::StringView((StringView *)&objcProto,"*");
    OutputStream::operator+=(local_18,_objcProto);
  }
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    // We rewrite objc_object<SomeProtocol>* into id<SomeProtocol>.
    if (Pointee->getKind() != KObjCProtoName ||
        !static_cast<const ObjCProtoName *>(Pointee)->isObjCObject()) {
      Pointee->printLeft(s);
      if (Pointee->hasArray(s))
        s += " ";
      if (Pointee->hasArray(s) || Pointee->hasFunction(s))
        s += "(";
      s += "*";
    } else {
      const auto *objcProto = static_cast<const ObjCProtoName *>(Pointee);
      s += "id<";
      s += objcProto->Protocol;
      s += ">";
    }
  }